

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_str_match_here(char *regexp,char *text)

{
  char cVar1;
  char cVar2;
  int iVar3;
  char *regexp_00;
  char cVar4;
  
  regexp_00 = regexp + 2;
  cVar4 = *regexp;
  while( true ) {
    if (cVar4 == '\0') {
      return 1;
    }
    cVar1 = regexp_00[-1];
    if (cVar1 == '*') {
      while( true ) {
        iVar3 = nk_str_match_here(regexp_00,text);
        if (iVar3 != 0) {
          return 1;
        }
        cVar1 = *text;
        if (cVar1 == '\0') break;
        text = text + 1;
        if (cVar4 != '.' && cVar1 != cVar4) {
          return 0;
        }
      }
      return 0;
    }
    cVar2 = *text;
    if (cVar4 == '$' && cVar1 == '\0') {
      return (uint)(cVar2 == '\0');
    }
    if (cVar2 == '\0') break;
    if (cVar4 != '.' && cVar4 != cVar2) {
      return 0;
    }
    text = text + 1;
    regexp_00 = regexp_00 + 1;
    cVar4 = cVar1;
  }
  return 0;
}

Assistant:

NK_INTERN int
nk_str_match_here(const char *regexp, const char *text)
{
    if (regexp[0] == '\0')
        return 1;
    if (regexp[1] == '*')
        return nk_str_match_star(regexp[0], regexp+2, text);
    if (regexp[0] == '$' && regexp[1] == '\0')
        return *text == '\0';
    if (*text!='\0' && (regexp[0]=='.' || regexp[0]==*text))
        return nk_str_match_here(regexp+1, text+1);
    return 0;
}